

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  undefined2 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_RCX;
  uint in_EDX;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  vector<unsigned_short> sym_freq16;
  elemental_vector local_48;
  
  local_48.m_p = (void *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  if (in_EDX == 0) {
    iVar2 = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_48,in_EDX,in_EDX == 1,2,(object_mover)0x0,false);
    memset((void *)((local_48._8_8_ & 0xffffffff) * 2 + (long)local_48.m_p),0,
           (ulong)(in_EDX - local_48.m_size) * 2);
    local_48.m_size = in_EDX;
    uVar5 = (ulong)in_EDX;
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar6 = *(uint *)(in_RCX + uVar3 * 4);
      uVar7 = (ulong)uVar6;
      if (uVar6 < (uint)uVar4) {
        uVar7 = uVar4;
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar7;
    } while (uVar5 != uVar3);
    uVar6 = (uint)uVar7;
    if (uVar6 == 0) {
      iVar2 = 0;
    }
    else {
      if (uVar6 < 0x10000) {
        if (in_EDX != 0) {
          uVar4 = 0;
          do {
            *(undefined2 *)((long)local_48.m_p + uVar4 * 2) = *(undefined2 *)(in_RCX + uVar4 * 4);
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
      }
      else if (in_EDX != 0) {
        uVar4 = 0;
        do {
          uVar3 = (ulong)*(uint *)(in_RCX + uVar4 * 4);
          if (uVar3 != 0) {
            uVar3 = uVar3 * 0xffff + (ulong)(uVar6 >> 1);
            uVar1 = (undefined2)(uVar3 / uVar7);
            if (uVar3 < uVar7) {
              uVar1 = 1;
            }
            *(undefined2 *)((long)local_48.m_p + uVar4 * 2) = uVar1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      iVar2 = init(this,(EVP_PKEY_CTX *)((ulong)ctx & 0xff));
    }
  }
  if (local_48.m_p != (void *)0x0) {
    crnlib_free(local_48.m_p);
  }
  return iVar2;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint* pSym_freq, uint code_size_limit) {
  CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

  crnlib::vector<uint16> sym_freq16(total_syms);

  uint max_freq = 0;
  for (uint i = 0; i < total_syms; i++)
    max_freq = math::maximum(max_freq, pSym_freq[i]);

  if (!max_freq)
    return false;

  if (max_freq <= cUINT16_MAX) {
    for (uint i = 0; i < total_syms; i++)
      sym_freq16[i] = static_cast<uint16>(pSym_freq[i]);
  } else {
    for (uint i = 0; i < total_syms; i++) {
      uint f = pSym_freq[i];
      if (!f)
        continue;

      uint64 fl = f;

      fl = ((fl << 16) - fl) + (max_freq >> 1);
      fl /= max_freq;
      if (fl < 1)
        fl = 1;

      CRNLIB_ASSERT(fl <= cUINT16_MAX);

      sym_freq16[i] = static_cast<uint16>(fl);
    }
  }

  return init(encoding, total_syms, &sym_freq16[0], code_size_limit);
}